

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# requantize_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::Requantize_x86_avx512::forward
          (Requantize_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint _elempack;
  int iVar1;
  uint _h;
  size_t sVar2;
  void *pvVar3;
  size_t sVar4;
  void *pvVar5;
  int *piVar6;
  size_t sVar7;
  size_t sVar8;
  long lVar9;
  size_t sVar10;
  int _w;
  int *piVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  bool bVar18;
  Mat local_148;
  Mat local_f8;
  Mat local_a8;
  Mat *local_60;
  Mat *local_58;
  long local_50;
  Mat *local_48;
  Mat *local_40;
  Mat *local_38;
  
  _elempack = bottom_blob->elempack;
  uVar12 = (ulong)_elempack;
  iVar1 = bottom_blob->dims;
  _w = bottom_blob->w;
  _h = bottom_blob->h;
  sVar10 = (size_t)(int)_elempack;
  local_58 = top_blob;
  if (iVar1 == 3) {
    local_60 = (Mat *)(ulong)(uint)bottom_blob->c;
    Mat::create(top_blob,_w,_h,bottom_blob->c,uVar12,_elempack,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    uVar12 = (ulong)local_60 & 0xffffffff;
    if ((int)local_60 < 1) {
      uVar12 = 0;
    }
    lVar9 = 0;
    for (uVar17 = 0; uVar12 != uVar17; uVar17 = uVar17 + 1) {
      sVar2 = bottom_blob->cstep;
      sVar4 = bottom_blob->elemsize;
      pvVar3 = bottom_blob->data;
      sVar7 = local_58->cstep;
      sVar8 = local_58->elemsize;
      pvVar5 = local_58->data;
      if ((this->super_Requantize).scale_in_data_size < 2) {
        piVar6 = (this->super_Requantize).scale_in_data.refcount;
        local_a8.data = (this->super_Requantize).scale_in_data.data;
        local_a8.refcount = (this->super_Requantize).scale_in_data.refcount;
        local_a8.elemsize = (this->super_Requantize).scale_in_data.elemsize;
        local_a8.elempack = (this->super_Requantize).scale_in_data.elempack;
        local_a8.allocator = (this->super_Requantize).scale_in_data.allocator;
        local_a8.dims = (this->super_Requantize).scale_in_data.dims;
        local_a8.w = (this->super_Requantize).scale_in_data.w;
        local_a8.h = (this->super_Requantize).scale_in_data.h;
        local_a8.d = (this->super_Requantize).scale_in_data.d;
        local_a8.c = (this->super_Requantize).scale_in_data.c;
        local_a8.cstep = (this->super_Requantize).scale_in_data.cstep;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
      }
      else {
        local_a8.elemsize = (this->super_Requantize).scale_in_data.elemsize;
        local_a8.data =
             (void *)(local_a8.elemsize * lVar9 + (long)(this->super_Requantize).scale_in_data.data)
        ;
        local_a8.elempack = (this->super_Requantize).scale_in_data.elempack;
        local_a8.allocator = (this->super_Requantize).scale_in_data.allocator;
        local_a8.refcount = (int *)0x0;
        local_a8.c = 1;
        local_a8.w = _elempack;
        local_a8.dims = 1;
        local_a8.h = 1;
        local_a8.d = 1;
        local_a8.cstep = sVar10;
      }
      if ((this->super_Requantize).bias_data_size < 2) {
        piVar6 = (this->super_Requantize).bias_data.refcount;
        local_f8.data = (this->super_Requantize).bias_data.data;
        local_f8.refcount = (this->super_Requantize).bias_data.refcount;
        local_f8.elemsize = (this->super_Requantize).bias_data.elemsize;
        local_f8.elempack = (this->super_Requantize).bias_data.elempack;
        local_f8.allocator = (this->super_Requantize).bias_data.allocator;
        local_f8.dims = (this->super_Requantize).bias_data.dims;
        local_f8.w = (this->super_Requantize).bias_data.w;
        local_f8.h = (this->super_Requantize).bias_data.h;
        local_f8.d = (this->super_Requantize).bias_data.d;
        local_f8.c = (this->super_Requantize).bias_data.c;
        local_f8.cstep = (this->super_Requantize).bias_data.cstep;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
      }
      else {
        local_f8.elemsize = (this->super_Requantize).bias_data.elemsize;
        local_f8.data =
             (void *)(local_f8.elemsize * lVar9 + (long)(this->super_Requantize).bias_data.data);
        local_f8.elempack = (this->super_Requantize).bias_data.elempack;
        local_f8.allocator = (this->super_Requantize).bias_data.allocator;
        local_f8.refcount = (int *)0x0;
        local_f8.c = 1;
        local_f8.w = _elempack;
        local_f8.dims = 1;
        local_f8.h = 1;
        local_f8.d = 1;
        local_f8.cstep = sVar10;
      }
      if ((this->super_Requantize).scale_out_data_size < 2) {
        piVar6 = (this->super_Requantize).scale_out_data.refcount;
        local_148.data = (this->super_Requantize).scale_out_data.data;
        piVar11 = (this->super_Requantize).scale_out_data.refcount;
        local_148.elemsize = (this->super_Requantize).scale_out_data.elemsize;
        local_148.elempack = (this->super_Requantize).scale_out_data.elempack;
        local_148.allocator = (this->super_Requantize).scale_out_data.allocator;
        local_148.dims = (this->super_Requantize).scale_out_data.dims;
        local_148.w = (this->super_Requantize).scale_out_data.w;
        local_148.h = (this->super_Requantize).scale_out_data.h;
        local_148.d = (this->super_Requantize).scale_out_data.d;
        local_148.c = (this->super_Requantize).scale_out_data.c;
        local_148.cstep = (this->super_Requantize).scale_out_data.cstep;
        local_148.refcount = piVar11;
        if (piVar6 == (int *)0x0) goto LAB_00417ac2;
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
      }
      else {
        local_148.elemsize = (this->super_Requantize).scale_out_data.elemsize;
        local_148.data =
             (void *)(local_148.elemsize * lVar9 +
                     (long)(this->super_Requantize).scale_out_data.data);
        local_148.elempack = (this->super_Requantize).scale_out_data.elempack;
        local_148.allocator = (this->super_Requantize).scale_out_data.allocator;
        local_148.refcount = (int *)0x0;
        local_148.c = 1;
        local_148.w = _elempack;
        local_148.dims = 1;
        local_148.h = 1;
        local_148.d = 1;
        local_148.cstep = sVar10;
LAB_00417ac2:
        piVar11 = (int *)0x0;
      }
      requantize((int *)(sVar2 * uVar17 * sVar4 + (long)pvVar3),
                 (char *)(sVar7 * uVar17 * sVar8 + (long)pvVar5),&local_a8,&local_f8,&local_148,
                 (this->super_Requantize).activation_type,
                 &(this->super_Requantize).activation_params,_h * _w,_elempack);
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          if (local_148.allocator == (Allocator *)0x0) {
            free(local_148.data);
          }
          else {
            (*(local_148.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (local_f8.refcount != (int *)0x0) {
        LOCK();
        *local_f8.refcount = *local_f8.refcount + -1;
        UNLOCK();
        if (*local_f8.refcount == 0) {
          if (local_f8.allocator == (Allocator *)0x0) {
            free(local_f8.data);
          }
          else {
            (*(local_f8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (local_a8.refcount != (int *)0x0) {
        LOCK();
        *local_a8.refcount = *local_a8.refcount + -1;
        UNLOCK();
        if (*local_a8.refcount == 0) {
          if (local_a8.allocator == (Allocator *)0x0) {
            free(local_a8.data);
          }
          else {
            (*(local_a8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      lVar9 = lVar9 + sVar10;
    }
  }
  else if (iVar1 == 2) {
    Mat::create(top_blob,_w,_h,uVar12,_elempack,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    uVar12 = (ulong)_h;
    if ((int)_h < 1) {
      uVar12 = 0;
    }
    lVar9 = 0;
    for (uVar17 = 0; uVar12 != uVar17; uVar17 = uVar17 + 1) {
      iVar1 = bottom_blob->w;
      sVar2 = bottom_blob->elemsize;
      pvVar3 = bottom_blob->data;
      iVar15 = local_58->w;
      sVar4 = local_58->elemsize;
      pvVar5 = local_58->data;
      if ((this->super_Requantize).scale_in_data_size < 2) {
        piVar6 = (this->super_Requantize).scale_in_data.refcount;
        local_a8.data = (this->super_Requantize).scale_in_data.data;
        local_a8.refcount = (this->super_Requantize).scale_in_data.refcount;
        local_a8.elemsize = (this->super_Requantize).scale_in_data.elemsize;
        local_a8.elempack = (this->super_Requantize).scale_in_data.elempack;
        local_a8.allocator = (this->super_Requantize).scale_in_data.allocator;
        local_a8.dims = (this->super_Requantize).scale_in_data.dims;
        local_a8.w = (this->super_Requantize).scale_in_data.w;
        local_a8.h = (this->super_Requantize).scale_in_data.h;
        local_a8.d = (this->super_Requantize).scale_in_data.d;
        local_a8.c = (this->super_Requantize).scale_in_data.c;
        local_a8.cstep = (this->super_Requantize).scale_in_data.cstep;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
      }
      else {
        local_a8.elemsize = (this->super_Requantize).scale_in_data.elemsize;
        local_a8.data =
             (void *)(local_a8.elemsize * lVar9 + (long)(this->super_Requantize).scale_in_data.data)
        ;
        local_a8.elempack = (this->super_Requantize).scale_in_data.elempack;
        local_a8.allocator = (this->super_Requantize).scale_in_data.allocator;
        local_a8.refcount = (int *)0x0;
        local_a8.c = 1;
        local_a8.w = _elempack;
        local_a8.dims = 1;
        local_a8.h = 1;
        local_a8.d = 1;
        local_a8.cstep = sVar10;
      }
      if ((this->super_Requantize).bias_data_size < 2) {
        piVar6 = (this->super_Requantize).bias_data.refcount;
        local_f8.data = (this->super_Requantize).bias_data.data;
        local_f8.refcount = (this->super_Requantize).bias_data.refcount;
        local_f8.elemsize = (this->super_Requantize).bias_data.elemsize;
        local_f8.elempack = (this->super_Requantize).bias_data.elempack;
        local_f8.allocator = (this->super_Requantize).bias_data.allocator;
        local_f8.dims = (this->super_Requantize).bias_data.dims;
        local_f8.w = (this->super_Requantize).bias_data.w;
        local_f8.h = (this->super_Requantize).bias_data.h;
        local_f8.d = (this->super_Requantize).bias_data.d;
        local_f8.c = (this->super_Requantize).bias_data.c;
        local_f8.cstep = (this->super_Requantize).bias_data.cstep;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
      }
      else {
        local_f8.elemsize = (this->super_Requantize).bias_data.elemsize;
        local_f8.data =
             (void *)(local_f8.elemsize * lVar9 + (long)(this->super_Requantize).bias_data.data);
        local_f8.elempack = (this->super_Requantize).bias_data.elempack;
        local_f8.allocator = (this->super_Requantize).bias_data.allocator;
        local_f8.refcount = (int *)0x0;
        local_f8.c = 1;
        local_f8.w = _elempack;
        local_f8.dims = 1;
        local_f8.h = 1;
        local_f8.d = 1;
        local_f8.cstep = sVar10;
      }
      if ((this->super_Requantize).scale_out_data_size < 2) {
        piVar6 = (this->super_Requantize).scale_out_data.refcount;
        local_148.data = (this->super_Requantize).scale_out_data.data;
        piVar11 = (this->super_Requantize).scale_out_data.refcount;
        local_148.elemsize = (this->super_Requantize).scale_out_data.elemsize;
        local_148.elempack = (this->super_Requantize).scale_out_data.elempack;
        local_148.allocator = (this->super_Requantize).scale_out_data.allocator;
        local_148.dims = (this->super_Requantize).scale_out_data.dims;
        local_148.w = (this->super_Requantize).scale_out_data.w;
        local_148.h = (this->super_Requantize).scale_out_data.h;
        local_148.d = (this->super_Requantize).scale_out_data.d;
        local_148.c = (this->super_Requantize).scale_out_data.c;
        local_148.cstep = (this->super_Requantize).scale_out_data.cstep;
        local_148.refcount = piVar11;
        if (piVar6 == (int *)0x0) goto LAB_00417641;
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
      }
      else {
        local_148.elemsize = (this->super_Requantize).scale_out_data.elemsize;
        local_148.data =
             (void *)(local_148.elemsize * lVar9 +
                     (long)(this->super_Requantize).scale_out_data.data);
        local_148.elempack = (this->super_Requantize).scale_out_data.elempack;
        local_148.allocator = (this->super_Requantize).scale_out_data.allocator;
        local_148.refcount = (int *)0x0;
        local_148.c = 1;
        local_148.w = _elempack;
        local_148.dims = 1;
        local_148.h = 1;
        local_148.d = 1;
        local_148.cstep = sVar10;
LAB_00417641:
        piVar11 = (int *)0x0;
      }
      requantize((int *)((long)iVar1 * uVar17 * sVar2 + (long)pvVar3),
                 (char *)((long)iVar15 * uVar17 * sVar4 + (long)pvVar5),&local_a8,&local_f8,
                 &local_148,(this->super_Requantize).activation_type,
                 &(this->super_Requantize).activation_params,_w,_elempack);
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          if (local_148.allocator == (Allocator *)0x0) {
            free(local_148.data);
          }
          else {
            (*(local_148.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (local_f8.refcount != (int *)0x0) {
        LOCK();
        *local_f8.refcount = *local_f8.refcount + -1;
        UNLOCK();
        if (*local_f8.refcount == 0) {
          if (local_f8.allocator == (Allocator *)0x0) {
            free(local_f8.data);
          }
          else {
            (*(local_f8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (local_a8.refcount != (int *)0x0) {
        LOCK();
        *local_a8.refcount = *local_a8.refcount + -1;
        UNLOCK();
        if (*local_a8.refcount == 0) {
          if (local_a8.allocator == (Allocator *)0x0) {
            free(local_a8.data);
          }
          else {
            (*(local_a8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      lVar9 = lVar9 + sVar10;
    }
  }
  else {
    if (iVar1 != 1) {
      return 0;
    }
    Mat::create(top_blob,_w,uVar12,_elempack,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    uVar12 = (long)_w / (long)opt->num_threads;
    uVar17 = 1;
    if (1 < (int)uVar12) {
      uVar17 = uVar12;
    }
    iVar1 = (int)uVar17;
    uVar12 = (long)(iVar1 + _w + -1) / (long)iVar1;
    uVar13 = uVar12 & 0xffffffff;
    local_60 = &(this->super_Requantize).scale_in_data;
    local_38 = &(this->super_Requantize).bias_data;
    local_40 = &(this->super_Requantize).scale_out_data;
    local_48 = &(this->super_Requantize).activation_params;
    if ((int)uVar12 < 1) {
      uVar13 = 0;
    }
    lVar9 = sVar10 * (uVar17 & 0xffffffff);
    local_50 = lVar9 * 4;
    lVar16 = 0;
    lVar14 = 0;
    while (bVar18 = uVar13 != 0, uVar13 = uVar13 - 1, bVar18) {
      iVar15 = _w;
      if (iVar1 < _w) {
        iVar15 = iVar1;
      }
      _w = -(iVar1 - _w);
      requantize((int *)((long)bottom_blob->data + lVar14),(char *)((long)local_58->data + lVar16),
                 local_60,local_38,local_40,(this->super_Requantize).activation_type,local_48,
                 iVar15 * _elempack,1);
      lVar14 = lVar14 + local_50;
      lVar16 = lVar16 + lVar9;
    }
  }
  return 0;
}

Assistant:

int Requantize_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int dims = bottom_blob.dims;
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int channels = bottom_blob.c;
    const int elempack = bottom_blob.elempack;
    const size_t out_elemsize = elempack * 1u;

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int wp = std::max(1, w / opt.num_threads);
        const int nn_w = (w + wp - 1) / wp;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_w; ii++)
        {
            const int i = ii * wp;

            const int* intptr = (const int*)bottom_blob + i * elempack;
            signed char* ptr = (signed char*)top_blob + i * elempack;

            // assert scale_in_data_size == 1
            // assert bias_data_size == 0 || bias_data_size == 1
            // assert scale_out_data_size == 1

            const int size = std::min(w - i, wp) * elempack;

            requantize(intptr, ptr, scale_in_data, bias_data, scale_out_data, activation_type, activation_params, size, 1);
        }
    }

    if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            const int* intptr = bottom_blob.row<const int>(i);
            signed char* ptr = top_blob.row<signed char>(i);

            const Mat scale_in_data_i = scale_in_data_size > 1 ? scale_in_data.range(i * elempack, elempack) : scale_in_data;
            const Mat bias_data_i = bias_data_size > 1 ? bias_data.range(i * elempack, elempack) : bias_data;
            const Mat scale_out_data_i = scale_out_data_size > 1 ? scale_out_data.range(i * elempack, elempack) : scale_out_data;

            requantize(intptr, ptr, scale_in_data_i, bias_data_i, scale_out_data_i, activation_type, activation_params, w, elempack);
        }
    }

    if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const int* intptr = bottom_blob.channel(q);
            signed char* ptr = top_blob.channel(q);

            const Mat scale_in_data_q = scale_in_data_size > 1 ? scale_in_data.range(q * elempack, elempack) : scale_in_data;
            const Mat bias_data_q = bias_data_size > 1 ? bias_data.range(q * elempack, elempack) : bias_data;
            const Mat scale_out_data_q = scale_out_data_size > 1 ? scale_out_data.range(q * elempack, elempack) : scale_out_data;

            requantize(intptr, ptr, scale_in_data_q, bias_data_q, scale_out_data_q, activation_type, activation_params, w * h, elempack);
        }
    }

    return 0;
}